

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_pool32a0_nanomips_insn(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 pTVar7;
  TCGv_i64 t;
  TCGv_i64 t0_5;
  TCGv_i64 t1_1;
  TCGv_i64 t0_4;
  TCGv_i64 t0_3;
  uint8_t sc;
  TCGv_i64 t0_2;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0_1;
  TCGv_i64 t0;
  int rd;
  int rs;
  int rt;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x15,5);
  uVar2 = extract32(ctx->opcode,0x10,5);
  uVar3 = extract32(ctx->opcode,0xb,5);
  uVar4 = extract32(ctx->opcode,3,7);
  switch(uVar4) {
  case 0:
    uVar3 = extract32(ctx->opcode,10,1);
    if (uVar3 == 0) {
      check_nms(ctx);
      gen_trap(ctx,0x34,uVar2,uVar1,-1);
    }
    else if (uVar3 == 1) {
      check_nms(ctx);
      gen_trap(ctx,0x36,uVar2,uVar1,-1);
    }
    break;
  case 1:
    check_nms(ctx);
    gen_bshfl(ctx,0x7c000420,uVar2,uVar1);
    break;
  case 2:
    gen_shift(ctx,4,uVar3,uVar1,uVar2);
    break;
  case 3:
    gen_r6_muldiv(ctx,0x98,uVar3,uVar2,uVar1);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 6:
    check_cp0_enabled(ctx);
    if (uVar1 != 0) {
      pTVar6 = tcg_ctx_00->cpu_gpr[(int)uVar1];
      uVar1 = extract32(ctx->opcode,0xb,3);
      gen_mfc0(ctx,pTVar6,uVar2,uVar1);
    }
    break;
  case 9:
    gen_bshfl(ctx,0x7c000620,uVar2,uVar1);
    break;
  case 10:
    gen_shift(ctx,6,uVar3,uVar1,uVar2);
    break;
  case 0xb:
    gen_r6_muldiv(ctx,0xd8,uVar3,uVar2,uVar1);
    break;
  case 0xe:
    check_cp0_enabled(ctx);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,pTVar6,uVar1);
    uVar1 = extract32(ctx->opcode,0xb,3);
    gen_mtc0(ctx,pTVar6,uVar2,uVar1);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x12:
    gen_shift(ctx,7,uVar3,uVar1,uVar2);
    break;
  case 0x13:
    gen_r6_muldiv(ctx,0x99,uVar3,uVar2,uVar1);
    break;
  case 0x1a:
    gen_shift(ctx,0x46,uVar3,uVar1,uVar2);
    break;
  case 0x1b:
    gen_r6_muldiv(ctx,0xd9,uVar3,uVar2,uVar1);
    break;
  case 0x22:
    gen_arith(ctx,0x20,uVar3,uVar2,uVar1);
    break;
  case 0x23:
    gen_r6_muldiv(ctx,0x9a,uVar3,uVar2,uVar1);
    break;
  case 0x2a:
    gen_arith(ctx,0x21,uVar3,uVar2,uVar1);
    break;
  case 0x2b:
    gen_r6_muldiv(ctx,0xda,uVar3,uVar2,uVar1);
    break;
  case 0x32:
    check_nms(ctx);
    gen_arith(ctx,0x22,uVar3,uVar2,uVar1);
    break;
  case 0x33:
    gen_r6_muldiv(ctx,0x9b,uVar3,uVar2,uVar1);
    break;
  case 0x38:
    check_nms(ctx);
    uVar3 = extract32(ctx->opcode,0xb,3);
    gen_rdhwr(ctx,uVar1,uVar2,uVar3);
    break;
  case 0x3a:
    gen_arith(ctx,0x23,uVar3,uVar2,uVar1);
    break;
  case 0x3b:
    gen_r6_muldiv(ctx,0xdb,uVar3,uVar2,uVar1);
    break;
  case 0x42:
    uVar4 = extract32(ctx->opcode,10,1);
    if (uVar4 == 0) {
      gen_cond_move(ctx,10,uVar3,uVar2,uVar1);
    }
    else if (uVar4 == 1) {
      gen_cond_move(ctx,0xb,uVar3,uVar2,uVar1);
    }
    break;
  case 0x45:
    check_mt(ctx);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,pTVar6,uVar1);
    gen_load_gpr(tcg_ctx_00,pTVar7,uVar2);
    gen_helper_fork(tcg_ctx_00,pTVar6,pTVar7);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar7);
    break;
  case 0x46:
  case 0x47:
    check_cp0_enabled(ctx);
    if (uVar3 != 0) {
      uVar3 = extract32(ctx->opcode,10,1);
      uVar4 = extract32(ctx->opcode,0xb,5);
      uVar5 = extract32(ctx->opcode,3,1);
      gen_mftr(env,ctx,uVar2,uVar1,uVar3,uVar4,uVar5);
    }
    break;
  case 0x4a:
    gen_logic(ctx,0x24,uVar3,uVar2,uVar1);
    break;
  case 0x4d:
    check_mt(ctx);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,pTVar6,uVar2);
    gen_helper_yield(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,pTVar6);
    gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x4e:
  case 0x4f:
    check_cp0_enabled(ctx);
    uVar3 = extract32(ctx->opcode,10,1);
    uVar4 = extract32(ctx->opcode,0xb,5);
    uVar5 = extract32(ctx->opcode,3,1);
    gen_mttr(env,ctx,uVar2,uVar1,uVar3,uVar4,uVar5);
    break;
  case 0x52:
    gen_logic(ctx,0x25,uVar3,uVar2,uVar1);
    break;
  case 0x56:
    uVar3 = extract32(ctx->opcode,10,1);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    if ((uVar3 & 0xff) == 0) {
      if (uVar2 == 1) {
        check_cp0_mt(ctx);
        gen_helper_dmt(tcg_ctx_00,pTVar6);
        gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
      }
      else if (uVar2 == 0) {
        check_cp0_mt(ctx);
        gen_helper_dvpe(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env);
        gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
    else if ((uVar3 & 0xff) == 1) {
      if (uVar2 == 1) {
        check_cp0_mt(ctx);
        gen_helper_emt(tcg_ctx_00,pTVar6);
        gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
      }
      else if (uVar2 == 0) {
        check_cp0_mt(ctx);
        gen_helper_evpe(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env);
        gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
      }
      else {
        generate_exception_end(ctx,0x14);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    break;
  case 0x5a:
    gen_logic(ctx,0x27,uVar3,uVar2,uVar1);
    break;
  case 0x62:
    gen_logic(ctx,0x26,uVar3,uVar2,uVar1);
    break;
  case 0x6a:
    gen_slt(ctx,0x2a,uVar3,uVar2,uVar1);
    break;
  case 0x72:
    if (uVar3 == 0) {
      pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
      uVar2 = extract32(ctx->opcode,10,1);
      if (uVar2 == 0) {
        if ((ctx->vp & 1U) != 0) {
          check_cp0_enabled(ctx);
          gen_helper_dvp(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env);
          gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
        }
      }
      else if ((uVar2 == 1) && ((ctx->vp & 1U) != 0)) {
        check_cp0_enabled(ctx);
        gen_helper_evp(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env);
        gen_store_gpr(tcg_ctx_00,pTVar6,uVar1);
      }
      tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    }
    else {
      gen_slt(ctx,0x2b,uVar3,uVar2,uVar1);
    }
    break;
  case 0x7a:
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i64(tcg_ctx_00);
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,pTVar7,uVar2);
    gen_load_gpr(tcg_ctx_00,t,uVar1);
    tcg_gen_add_i64(tcg_ctx_00,pTVar6,pTVar7,t);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,pTVar6,pTVar6);
    tcg_gen_xor_i64_mips64el(tcg_ctx_00,pTVar7,pTVar7,t);
    tcg_gen_xor_i64_mips64el(tcg_ctx_00,t,pTVar6,t);
    tcg_gen_andc_i64_mips64el(tcg_ctx_00,pTVar7,t,pTVar7);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_LT,pTVar6,pTVar7,0);
    gen_store_gpr(tcg_ctx_00,pTVar6,uVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar7);
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_pool32a0_nanomips_insn(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = extract32(ctx->opcode, 21, 5);
    int rs = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (extract32(ctx->opcode, 3, 7)) {
    case NM_P_TRAP:
        switch (extract32(ctx->opcode, 10, 1)) {
        case NM_TEQ:
            check_nms(ctx);
            gen_trap(ctx, OPC_TEQ, rs, rt, -1);
            break;
        case NM_TNE:
            check_nms(ctx);
            gen_trap(ctx, OPC_TNE, rs, rt, -1);
            break;
        }
        break;
    case NM_RDHWR:
        check_nms(ctx);
        gen_rdhwr(ctx, rt, rs, extract32(ctx->opcode, 11, 3));
        break;
    case NM_SEB:
        check_nms(ctx);
        gen_bshfl(ctx, OPC_SEB, rs, rt);
        break;
    case NM_SEH:
        gen_bshfl(ctx, OPC_SEH, rs, rt);
        break;
    case NM_SLLV:
        gen_shift(ctx, OPC_SLLV, rd, rt, rs);
        break;
    case NM_SRLV:
        gen_shift(ctx, OPC_SRLV, rd, rt, rs);
        break;
    case NM_SRAV:
        gen_shift(ctx, OPC_SRAV, rd, rt, rs);
        break;
    case NM_ROTRV:
        gen_shift(ctx, OPC_ROTRV, rd, rt, rs);
        break;
    case NM_ADD:
        gen_arith(ctx, OPC_ADD, rd, rs, rt);
        break;
    case NM_ADDU:
        gen_arith(ctx, OPC_ADDU, rd, rs, rt);
        break;
    case NM_SUB:
        check_nms(ctx);
        gen_arith(ctx, OPC_SUB, rd, rs, rt);
        break;
    case NM_SUBU:
        gen_arith(ctx, OPC_SUBU, rd, rs, rt);
        break;
    case NM_P_CMOVE:
        switch (extract32(ctx->opcode, 10, 1)) {
        case NM_MOVZ:
            gen_cond_move(ctx, OPC_MOVZ, rd, rs, rt);
            break;
        case NM_MOVN:
            gen_cond_move(ctx, OPC_MOVN, rd, rs, rt);
            break;
        }
        break;
    case NM_AND:
        gen_logic(ctx, OPC_AND, rd, rs, rt);
        break;
    case NM_OR:
        gen_logic(ctx, OPC_OR, rd, rs, rt);
        break;
    case NM_NOR:
        gen_logic(ctx, OPC_NOR, rd, rs, rt);
        break;
    case NM_XOR:
        gen_logic(ctx, OPC_XOR, rd, rs, rt);
        break;
    case NM_SLT:
        gen_slt(ctx, OPC_SLT, rd, rs, rt);
        break;
    case NM_P_SLTU:
        if (rd == 0) {
            /* P_DVP */
            TCGv t0 = tcg_temp_new(tcg_ctx);
            switch (extract32(ctx->opcode, 10, 1)) {
            case NM_DVP:
                if (ctx->vp) {
                    check_cp0_enabled(ctx);
                    gen_helper_dvp(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                }
                break;
            case NM_EVP:
                if (ctx->vp) {
                    check_cp0_enabled(ctx);
                    gen_helper_evp(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                }
                break;
            }
            tcg_temp_free(tcg_ctx, t0);
        } else {
            gen_slt(ctx, OPC_SLTU, rd, rs, rt);
        }
        break;
    case NM_SOV:
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);

            /* operands of same sign, result different sign */
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, t0, t1, 0);
            gen_store_gpr(tcg_ctx, t0, rd);

            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case NM_MUL:
        gen_r6_muldiv(ctx, R6_OPC_MUL, rd, rs, rt);
        break;
    case NM_MUH:
        gen_r6_muldiv(ctx, R6_OPC_MUH, rd, rs, rt);
        break;
    case NM_MULU:
        gen_r6_muldiv(ctx, R6_OPC_MULU, rd, rs, rt);
        break;
    case NM_MUHU:
        gen_r6_muldiv(ctx, R6_OPC_MUHU, rd, rs, rt);
        break;
    case NM_DIV:
        gen_r6_muldiv(ctx, R6_OPC_DIV, rd, rs, rt);
        break;
    case NM_MOD:
        gen_r6_muldiv(ctx, R6_OPC_MOD, rd, rs, rt);
        break;
    case NM_DIVU:
        gen_r6_muldiv(ctx, R6_OPC_DIVU, rd, rs, rt);
        break;
    case NM_MODU:
        gen_r6_muldiv(ctx, R6_OPC_MODU, rd, rs, rt);
        break;
    case NM_MFC0:
        check_cp0_enabled(ctx);
        if (rt == 0) {
            /* Treat as NOP. */
            break;
        }
        gen_mfc0(ctx, tcg_ctx->cpu_gpr[rt], rs, extract32(ctx->opcode, 11, 3));
        break;
    case NM_MTC0:
        check_cp0_enabled(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_mtc0(ctx, t0, rs, extract32(ctx->opcode, 11, 3));
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case NM_D_E_MT_VPE:
        {
            uint8_t sc = extract32(ctx->opcode, 10, 1);
            TCGv t0 = tcg_temp_new(tcg_ctx);

            switch (sc) {
            case 0:
                if (rs == 1) {
                    /* DMT */
                    check_cp0_mt(ctx);
                    gen_helper_dmt(tcg_ctx, t0);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else if (rs == 0) {
                    /* DVPE */
                    check_cp0_mt(ctx);
                    gen_helper_dvpe(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else {
                    generate_exception_end(ctx, EXCP_RI);
                }
                break;
            case 1:
                if (rs == 1) {
                    /* EMT */
                    check_cp0_mt(ctx);
                    gen_helper_emt(tcg_ctx, t0);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else if (rs == 0) {
                    /* EVPE */
                    check_cp0_mt(ctx);
                    gen_helper_evpe(tcg_ctx, t0, tcg_ctx->cpu_env);
                    gen_store_gpr(tcg_ctx, t0, rt);
                } else {
                    generate_exception_end(ctx, EXCP_RI);
                }
                break;
            }

            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case NM_FORK:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rt);
            gen_load_gpr(tcg_ctx, t1, rs);
            gen_helper_fork(tcg_ctx, t0, t1);
            tcg_temp_free(tcg_ctx, t0);
            tcg_temp_free(tcg_ctx, t1);
        }
        break;
    case NM_MFTR:
    case NM_MFHTR:
        check_cp0_enabled(ctx);
        if (rd == 0) {
            /* Treat as NOP. */
            return;
        }
        gen_mftr(env, ctx, rs, rt, extract32(ctx->opcode, 10, 1),
                 extract32(ctx->opcode, 11, 5), extract32(ctx->opcode, 3, 1));
        break;
    case NM_MTTR:
    case NM_MTHTR:
        check_cp0_enabled(ctx);
        gen_mttr(env, ctx, rs, rt, extract32(ctx->opcode, 10, 1),
                 extract32(ctx->opcode, 11, 5), extract32(ctx->opcode, 3, 1));
        break;
    case NM_YIELD:
        check_mt(ctx);
        {
            TCGv t0 = tcg_temp_new(tcg_ctx);

            gen_load_gpr(tcg_ctx, t0, rs);
            gen_helper_yield(tcg_ctx, t0, tcg_ctx->cpu_env, t0);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}